

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoelrefpattern.h.h
# Opt level: O1

void __thiscall
TPZGeoElRefPattern<pzgeom::TPZWavyLine>::TPZGeoElRefPattern
          (TPZGeoElRefPattern<pzgeom::TPZWavyLine> *this)

{
  TPZReference *pTVar1;
  
  *(undefined ***)&(this->super_TPZGeoElRefLess<pzgeom::TPZWavyLine>).super_TPZGeoEl =
       &PTR__TPZSavable_018c1280;
  TPZGeoElRefLess<pzgeom::TPZWavyLine>::TPZGeoElRefLess
            (&this->super_TPZGeoElRefLess<pzgeom::TPZWavyLine>,&PTR_PTR_018c0b58);
  *(undefined ***)&(this->super_TPZGeoElRefLess<pzgeom::TPZWavyLine>).super_TPZGeoEl =
       &PTR__TPZGeoElRefPattern_018c0858;
  TPZVec<long>::TPZVec(&this->fSubEl,0);
  pTVar1 = (TPZReference *)operator_new(0x10);
  pTVar1->fPointer = (TPZRefPattern *)0x0;
  (pTVar1->fCounter).super___atomic_base<int>._M_i = 0;
  LOCK();
  (pTVar1->fCounter).super___atomic_base<int>._M_i = 1;
  UNLOCK();
  (this->fRefPattern).fRef = pTVar1;
  return;
}

Assistant:

TPZGeoElRefPattern<TGeo>::TPZGeoElRefPattern():TPZRegisterClassId(&TPZGeoElRefPattern<TGeo>::ClassId),
TPZGeoElRefLess<TGeo>(), fSubEl(0), fRefPattern(0)
{
}